

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maplayers.cpp
# Opt level: O2

void CMapLayers::EnvelopeEval(float TimeOffset,int Env,float *pChannels,void *pUser)

{
  CEnvPoint *pPoints;
  long lVar1;
  int *piVar2;
  __type _Var3;
  int *piVar4;
  int NumPoints;
  long lVar5;
  long in_FS_OFFSET;
  float __y;
  float fVar6;
  float fVar7;
  long lStack_70;
  int Num;
  int Start;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pChannels[0] = 0.0;
  pChannels[1] = 0.0;
  pChannels[2] = 0.0;
  pChannels[3] = 0.0;
  if (*(int *)(*(long *)(*(long *)((long)pUser + 8) + 0x858) + 0x10) - 3U < 2) {
    lVar5 = *(long *)((long)pUser + 8) + 0x8b0;
    lStack_70 = 0x28;
  }
  else {
    lVar5 = *(long *)((long)pUser + 0x10);
    lStack_70 = 0x38;
  }
  lVar1 = *(long *)((long)pUser + lStack_70);
  (**(code **)(**(long **)(lVar5 + 0x20) + 0x30))(*(long **)(lVar5 + 0x20),3,&Start,&Num);
  if (Env < Num) {
    piVar4 = (int *)(**(code **)(**(long **)(lVar5 + 0x20) + 0x28))
                              (*(long **)(lVar5 + 0x20),Env + Start,0,0);
    pPoints = (CEnvPoint *)((long)piVar4[2] * 0x58 + lVar1);
    NumPoints = piVar4[3];
    lVar5 = *(long *)(*(long *)((long)pUser + 8) + 0x858);
    if (*(int *)(lVar5 + 0x10) - 3U < 2) {
      piVar2 = *(int **)(*(long *)((long)pUser + 8) + 0xdf8);
      if ((piVar2 != (int *)0x0) && ((*(byte *)(piVar2 + 1) & 0x1c) == 0)) {
        if ((*piVar4 < 2) || (piVar4[0xc] != 0)) {
          __y = ((float)(pPoints[(long)NumPoints + -1].super_CEnvPoint_v1.m_Time -
                        *(int *)(lVar1 + (long)piVar4[2] * 0x58)) / 1000.0) *
                (float)*(int *)(lVar5 + 0x34);
          _Var3 = std::fmod<int,float>(*(int *)(lVar5 + 0x14) - *piVar2,__y);
          fVar6 = (float)_Var3;
          _Var3 = std::fmod<int,float>
                            (*(int *)(*(long *)(*(long *)((long)pUser + 8) + 0x858) + 0x18) -
                             **(int **)(*(long *)((long)pUser + 8) + 0xdf8),__y);
          fVar7 = (float)_Var3;
          lVar5 = *(long *)(*(long *)((long)pUser + 8) + 0x858);
          EnvelopeEval::s_Time =
               (((float)(~-(uint)(fVar7 < fVar6) & (uint)fVar7 |
                        (uint)(__y + fVar7) & -(uint)(fVar7 < fVar6)) - fVar6) *
                *(float *)(lVar5 + 0x1c) + fVar6) / (float)*(int *)(lVar5 + 0x34);
          NumPoints = piVar4[3];
        }
        else {
          EnvelopeEval::s_Time = *(float *)(lVar5 + 0x2c) - *(float *)((long)pUser + 0x24);
        }
      }
    }
    else {
      EnvelopeEval::s_Time = *(float *)(lVar5 + 0x2c);
    }
    CRenderTools::RenderEvalEnvelope
              (pPoints,NumPoints,4,TimeOffset + EnvelopeEval::s_Time,pChannels);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CMapLayers::EnvelopeEval(float TimeOffset, int Env, float *pChannels, void *pUser)
{
	CMapLayers *pThis = (CMapLayers *)pUser;
	pChannels[0] = 0;
	pChannels[1] = 0;
	pChannels[2] = 0;
	pChannels[3] = 0;

	CEnvPoint *pPoints = 0;
	CLayers *pLayers = 0;
	if(pThis->Client()->State() == IClient::STATE_ONLINE || pThis->Client()->State() == IClient::STATE_DEMOPLAYBACK)
	{
		pLayers = pThis->Layers();
		pPoints = pThis->m_lEnvPoints.base_ptr();
	}
	else
	{
		pLayers = pThis->m_pMenuLayers;
		pPoints = pThis->m_lEnvPointsMenu.base_ptr();
	}

	int Start, Num;
	pLayers->Map()->GetType(MAPITEMTYPE_ENVELOPE, &Start, &Num);

	if(Env >= Num)
		return;

	const CMapItemEnvelope *pItem = (CMapItemEnvelope *)pLayers->Map()->GetItem(Start+Env, 0, 0);
	CEnvPoint *pItemPoints = pPoints + pItem->m_StartPoint;

	static float s_Time = 0.0f;
	float EnvalopTicks = (pItemPoints[pItem->m_NumPoints-1].m_Time - pItemPoints[0].m_Time)/1000.0f * pThis->Client()->GameTickSpeed();
	if(pThis->Client()->State() == IClient::STATE_ONLINE || pThis->Client()->State() == IClient::STATE_DEMOPLAYBACK)
	{
		if(pThis->m_pClient->m_Snap.m_pGameData && !pThis->m_pClient->IsWorldPaused())
		{
			if(pItem->m_Version < 2 || pItem->m_Synchronized)
			{
				float PrevAnimationTick = fmod(pThis->Client()->PrevGameTick() - pThis->m_pClient->m_Snap.m_pGameData->m_GameStartTick, EnvalopTicks);
				float CurAnimationTick = fmod(pThis->Client()->GameTick() - pThis->m_pClient->m_Snap.m_pGameData->m_GameStartTick, EnvalopTicks);
				if(PrevAnimationTick > CurAnimationTick)
					CurAnimationTick += EnvalopTicks;
				s_Time = mix(PrevAnimationTick, CurAnimationTick, pThis->Client()->IntraGameTick()) / pThis->Client()->GameTickSpeed();
			}
			else
				s_Time = pThis->Client()->LocalTime() - pThis->m_OnlineStartTime;
		}
	}
	else
	{
		s_Time = pThis->Client()->LocalTime();
	}
	CRenderTools::RenderEvalEnvelope(pItemPoints, pItem->m_NumPoints, 4, s_Time + TimeOffset, pChannels);
}